

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *this_00;
  TestInfo *__s;
  allocator<char> local_39;
  string local_38 [24];
  undefined8 in_stack_ffffffffffffffe0;
  TestInfo *info;
  DeathTest *this_local;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_0026e880;
  this_00 = GetUnitTestImpl();
  __s = UnitTestImpl::current_test_info(this_00);
  if (__s == (TestInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s
               ,(allocator<char> *)in_stack_ffffffffffffffe0);
    DeathTestAbort((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == NULL) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}